

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestRuleVariablesInScope::Run(GraphTestRuleVariablesInScope *this)

{
  int iVar1;
  Edge *this_00;
  Test *this_01;
  bool condition;
  Node *pNVar2;
  allocator<char> local_41;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  depfile = x\n  command = depfile is $depfile\nbuild out: r in\n",
              (ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out",&local_41);
    pNVar2 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_40);
    this_00 = pNVar2->in_edge_;
    std::__cxx11::string::~string((string *)&local_40);
    this_01 = g_current_test;
    Edge::EvaluateCommand_abi_cxx11_(&local_40,this_00,false);
    condition = std::operator==("depfile is x",&local_40);
    testing::Test::Check
              (this_01,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x11b,"\"depfile is x\" == edge->EvaluateCommand()");
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(GraphTest, RuleVariablesInScope) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule r\n"
"  depfile = x\n"
"  command = depfile is $depfile\n"
"build out: r in\n"));
  Edge* edge = GetNode("out")->in_edge();
  EXPECT_EQ("depfile is x", edge->EvaluateCommand());
}